

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target,string *mocExecutable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  _Alloc_hider __nptr;
  char cVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  char *str;
  cmValue cVar9;
  cmValue cVar10;
  pointer pIVar11;
  IntegerVersion *pIVar12;
  long *plVar13;
  cmTarget *this;
  istream *piVar14;
  int *piVar15;
  size_type *psVar16;
  size_type sVar17;
  uint uVar18;
  long lVar19;
  string *this_00;
  IntegerVersion IVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar24;
  string major;
  unsigned_long tmp;
  string capturedStdOut;
  int exitCode;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  string mocTargetName;
  string local_270;
  cmGeneratorTarget *local_250;
  uint local_244;
  IntegerVersion local_240;
  undefined8 local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  string local_220;
  int local_1fc;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> local_1f8;
  string *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  IntegerVersion local_1b8;
  string local_1b0;
  long *local_190 [2];
  long local_180;
  undefined2 local_178;
  ios_base local_138 [264];
  
  local_250 = target;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"QT_MAJOR_VERSION","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  str = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(local_250,&local_1b0,&local_270);
  local_240.Major = 0;
  local_240.Minor = 0;
  uVar18 = 0;
  if ((str != (char *)0x0) &&
     (bVar6 = cmStrToULong(str,(unsigned_long *)&local_240), uVar18 = 0, bVar6)) {
    uVar18 = local_240.Major;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,(ulong)(local_270.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_1f8.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_244 = uVar18;
  local_1e0 = mocExecutable;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            (&local_1f8,6);
  lVar19 = 0x18;
  do {
    pcVar3 = local_250->Makefile;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,*(long *)(InitScanFiles()::suffixes + lVar19 + 0x10),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 8) +
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x10));
    cVar9 = cmMakefile::GetDefinition(pcVar3,&local_1b0);
    pcVar3 = local_250->Makefile;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x18) +
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19));
    cVar10 = cmMakefile::GetDefinition(pcVar3,&local_270);
    local_240.Major = 0;
    local_240.Minor = 0;
    uVar18 = 0;
    if (cVar9.Value != (string *)0x0) {
      bVar6 = cmStrToULong(cVar9.Value,(unsigned_long *)&local_240);
      uVar18 = 0;
      if (bVar6) {
        uVar18 = local_240.Major;
      }
    }
    local_240.Major = 0;
    local_240.Minor = 0;
    uVar22 = 0;
    if ((cVar10.Value != (string *)0x0) &&
       (bVar6 = cmStrToULong(cVar10.Value,(unsigned_long *)&local_240), bVar6)) {
      uVar22 = local_240.Major;
    }
    local_240.Minor = uVar22;
    local_240.Major = uVar18;
    if (uVar18 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_1f8,&local_240);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x78);
  lVar19 = 0x18;
  do {
    pcVar3 = local_250->Makefile;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,*(long *)(InitScanFiles()::suffixes + lVar19 + 0x10),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 8) +
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x10));
    cVar9 = cmMakefile::GetProperty(pcVar3,&local_1b0);
    pcVar3 = local_250->Makefile;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x18) +
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19));
    cVar10 = cmMakefile::GetProperty(pcVar3,&local_270);
    local_240.Major = 0;
    local_240.Minor = 0;
    uVar18 = 0;
    if (cVar9.Value != (string *)0x0) {
      bVar6 = cmStrToULong(cVar9.Value,(unsigned_long *)&local_240);
      uVar18 = 0;
      if (bVar6) {
        uVar18 = local_240.Major;
      }
    }
    local_240.Major = 0;
    local_240.Minor = 0;
    uVar22 = 0;
    if ((cVar10.Value != (string *)0x0) &&
       (bVar6 = cmStrToULong(cVar10.Value,(unsigned_long *)&local_240), uVar22 = 0, bVar6)) {
      uVar22 = local_240.Major;
    }
    local_240.Minor = uVar22;
    local_240.Major = uVar18;
    if (uVar18 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_1f8,&local_240);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x78);
  uVar23 = 0;
  if (local_1f8.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pIVar11 = local_1f8.
              super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_244 == 0) {
      IVar20 = *local_1f8.
                super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = (ulong)IVar20 >> 0x20;
LAB_0049e1bb:
      if (IVar20.Major != 0) goto LAB_0049e6e1;
    }
    else {
      do {
        if (pIVar11->Major == local_244) {
          uVar23 = (ulong)pIVar11->Minor;
          IVar20.Minor = 0;
          IVar20.Major = local_244;
          goto LAB_0049e1bb;
        }
        pIVar11 = pIVar11 + 1;
      } while (pIVar11 !=
               local_1f8.
               super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  sVar17 = local_1e0->_M_string_length;
  paVar1 = &local_220.field_2;
  this_00 = local_1e0;
  if (sVar17 == 0) {
    pcVar3 = local_250->Makefile;
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    cVar7 = '\x01';
    if (9 < local_244) {
      uVar18 = local_244;
      cVar5 = '\x04';
      do {
        cVar7 = cVar5;
        if (uVar18 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_0049e255;
        }
        if (uVar18 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_0049e255;
        }
        if (uVar18 < 10000) goto LAB_0049e255;
        bVar6 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar5 = cVar7 + '\x04';
      } while (bVar6);
      cVar7 = cVar7 + '\x01';
    }
LAB_0049e255:
    local_240 = (IntegerVersion)&local_230;
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_240,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_240,(uint)local_238,local_244);
    pIVar12 = (IntegerVersion *)
              std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0x7cb36b);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    IVar20 = (IntegerVersion)(pIVar12 + 2);
    if (*pIVar12 == IVar20) {
      local_270.field_2._M_allocated_capacity = *(undefined8 *)IVar20;
      local_270.field_2._8_8_ = pIVar12[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = *(undefined8 *)IVar20;
      local_270._M_dataplus._M_p = (pointer)*pIVar12;
    }
    local_270._M_string_length = *(size_type *)(pIVar12 + 1);
    *pIVar12 = IVar20;
    pIVar12[1].Major = 0;
    pIVar12[1].Minor = 0;
    *(undefined1 *)&pIVar12[2].Major = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_1b0.field_2._M_allocated_capacity = *psVar16;
      local_1b0.field_2._8_8_ = plVar13[3];
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar16;
      local_1b0._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1b0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if (local_240 != (IntegerVersion)&local_230) {
      operator_delete((void *)local_240,CONCAT71(uStack_22f,local_230) + 1);
    }
    this = cmMakefile::FindTargetToUse(pcVar3,&local_1b0,false);
    this_00 = local_1e0;
    if (this != (cmTarget *)0x0) {
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      local_240.Major = 0x11;
      local_240.Minor = 0;
      local_270._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_240);
      local_270.field_2._M_allocated_capacity._0_4_ = local_240.Major;
      local_270.field_2._M_allocated_capacity._4_4_ = local_240.Minor;
      *(undefined8 *)local_270._M_dataplus._M_p = 0x444554524f504d49;
      builtin_strncpy((char *)((long)local_270._M_dataplus._M_p + 8),"_LOCATIO",8);
      *(char *)((long)local_270._M_dataplus._M_p + 0x10) = 'N';
      local_270._M_string_length._0_4_ = local_240.Major;
      local_270._M_string_length._4_4_ = local_240.Minor;
      *(char *)((long)local_270._M_dataplus._M_p + (long)local_240) = '\0';
      cmTarget::GetSafeProperty(this,&local_270);
      std::__cxx11::string::_M_assign((string *)&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        (ulong)(local_270.field_2._M_allocated_capacity + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,
                      CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                               local_220.field_2._M_local_buf[0]) + 1);
    }
    sVar17 = this_00->_M_string_length;
    if (sVar17 == 0) {
      IVar20.Major = 0;
      IVar20.Minor = 0;
      goto LAB_0049e6e1;
    }
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  pcVar4 = (this_00->_M_dataplus)._M_p;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  local_220._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,pcVar4,pcVar4 + sVar17);
  plVar13 = &local_180;
  local_180 = 0x6f69737265762d2d;
  local_178 = 0x6e;
  local_190[1] = (long *)0x9;
  __l._M_len = 2;
  __l._M_array = &local_1b0;
  local_190[0] = plVar13;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_270,__l,(allocator_type *)&local_240);
  bVar6 = cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_270,&local_220,(string *)0x0,&local_1fc,(char *)0x0,OUTPUT_NONE,
                     (cmDuration)0x0,Auto);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_270);
  lVar19 = -0x40;
  do {
    if (plVar13 != (long *)plVar13[-2]) {
      operator_delete((long *)plVar13[-2],*plVar13 + 1);
    }
    plVar13 = plVar13 + -4;
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0);
  if (bVar6 && local_1fc == 0) {
    local_1d8[0] = local_1c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,local_220._M_dataplus._M_p,
               local_220._M_dataplus._M_p + local_220._M_string_length);
    if (parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_ == '\0') {
      GetQtVersion();
    }
    IVar20.Major = 0;
    IVar20.Minor = 0;
    lVar19 = std::__cxx11::string::find
                       ((char *)local_1d8,parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_,
                        0);
    if (lVar19 != -1) {
      std::__cxx11::string::erase((ulong)local_1d8,0);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_1b0,(string *)local_1d8,_S_in);
      local_270._M_string_length._0_4_ = 0;
      local_270._M_string_length._4_4_ = 0;
      local_270.field_2._M_allocated_capacity =
           local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_238 = 0;
      local_230 = 0;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      local_240 = (IntegerVersion)&local_230;
      piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_1b0,(string *)&local_270,'.');
      if ((((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) == 0) &&
         (piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&local_1b0,(string *)&local_240,'.'),
         __nptr._M_p = local_270._M_dataplus._M_p,
         ((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) == 0)) {
        piVar15 = __errno_location();
        iVar2 = *piVar15;
        *piVar15 = 0;
        uVar23 = strtol(__nptr._M_p,(char **)&local_1b8,10);
        IVar20 = local_240;
        if (local_1b8 == (IntegerVersion)__nptr._M_p) {
          std::__throw_invalid_argument("stoi");
LAB_0049e80a:
          std::__throw_out_of_range("stoi");
        }
        if (((long)(int)uVar23 != uVar23) || (iVar8 = *piVar15, iVar8 == 0x22)) goto LAB_0049e80a;
        if (iVar8 == 0) {
          *piVar15 = iVar2;
          iVar8 = iVar2;
        }
        local_250 = (cmGeneratorTarget *)CONCAT44(local_250._4_4_,iVar8);
        *piVar15 = 0;
        lVar19 = strtol((char *)local_240,(char **)&local_1b8,10);
        if (local_1b8 == IVar20) {
          std::__throw_invalid_argument("stoi");
LAB_0049e822:
          std::__throw_out_of_range("stoi");
        }
        if ((lVar19 - 0x80000000U < 0xffffffff00000000) || (*piVar15 == 0x22)) goto LAB_0049e822;
        if (*piVar15 == 0) {
          *piVar15 = (int)local_250;
        }
        uVar21 = lVar19 << 0x20;
        uVar23 = uVar23 & 0xffffffff;
      }
      else {
        uVar23 = 0;
        uVar21 = 0;
      }
      if (local_240 != (IntegerVersion)&local_230) {
        operator_delete((void *)local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        (ulong)(local_270.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
      std::ios_base::~ios_base(local_138);
      IVar20 = (IntegerVersion)(uVar21 | uVar23);
    }
    uVar23 = (ulong)IVar20 >> 0x20;
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
  }
  else {
    IVar20.Major = 0;
    IVar20.Minor = 0;
    uVar23 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                             local_220.field_2._M_local_buf[0]) + 1);
  }
LAB_0049e6e1:
  if (local_1f8.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar24.first = (IntegerVersion)((ulong)IVar20 & 0xffffffff | uVar23 << 0x20);
  pVar24.second = local_244;
  return pVar24;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target,
                                     std::string mocExecutable)
{
  // Converts a char ptr to an unsigned int value
  auto toUInt = [](const char* const input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };
  auto toUInt2 = [](cmValue input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(*input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };

  // Initialize return value to a default
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    toUInt(target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION",
                                                           "")));

  // Acquire known Qt versions
  std::vector<cmQtAutoGen::IntegerVersion> knownQtVersions;
  {
    // Qt version variable prefixes
    static std::initializer_list<
      std::pair<cm::string_view, cm::string_view>> const keys{
      { "Qt6Core_VERSION_MAJOR", "Qt6Core_VERSION_MINOR" },
      { "Qt5Core_VERSION_MAJOR", "Qt5Core_VERSION_MINOR" },
      { "QT_VERSION_MAJOR", "QT_VERSION_MINOR" },
    };

    knownQtVersions.reserve(keys.size() * 2);

    // Adds a version to the result (nullptr safe)
    auto addVersion = [&knownQtVersions, &toUInt2](cmValue major,
                                                   cmValue minor) {
      cmQtAutoGen::IntegerVersion ver(toUInt2(major), toUInt2(minor));
      if (ver.Major != 0) {
        knownQtVersions.emplace_back(ver);
      }
    };

    // Read versions from variables
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetDefinition(std::string(keyPair.first)),
                 target->Makefile->GetDefinition(std::string(keyPair.second)));
    }

    // Read versions from directory properties
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetProperty(std::string(keyPair.first)),
                 target->Makefile->GetProperty(std::string(keyPair.second)));
    }
  }

  // Evaluate known Qt versions
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }

  if (res.first.Major == 0) {
    // We could not get the version number from variables or directory
    // properties. This might happen if the find_package call for Qt is wrapped
    // in a function. Try to find the moc executable path from the available
    // targets and call "moc --version" to get the Qt version.
    if (mocExecutable.empty()) {
      mocExecutable =
        FindMocExecutableFromMocTarget(target->Makefile, res.second);
    }
    if (!mocExecutable.empty()) {
      res.first = GetMocVersion(mocExecutable);
    }
  }

  return res;
}